

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getnetconfig.c
# Opt level: O3

void * setnetconfig(void)

{
  undefined8 *puVar1;
  int *piVar2;
  
  puVar1 = (undefined8 *)
           (*__ntirpc_pkg_params.calloc_)
                     (1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/getnetconfig.c"
                      ,0xbd,"setnetconfig");
  pthread_mutex_lock((pthread_mutex_t *)&nc_mtx);
  ni_1 = ni_1 + 1;
  if ((nc_file == (FILE *)0x0) &&
     (nc_file = (FILE *)fopen("/etc/netconfig","r"), (FILE *)nc_file == (FILE *)0x0)) {
    ni_1 = ni_1 + -1;
    pthread_mutex_unlock((pthread_mutex_t *)&nc_mtx);
    piVar2 = __nc_error();
    *piVar2 = 2;
    (*__ntirpc_pkg_params.free_size_)(puVar1,0x10);
    return (void *)0x0;
  }
  *puVar1 = 0xfeed;
  puVar1[1] = ni_2;
  pthread_mutex_unlock((pthread_mutex_t *)&nc_mtx);
  return puVar1;
}

Assistant:

void *
setnetconfig(void)
{
	struct netconfig_vars *nc_vars = (struct netconfig_vars *)
		mem_zalloc(sizeof(struct netconfig_vars));

	/*
	 * For multiple calls, i.e. nc_file is not NULL, we just return the
	 * handle without reopening the netconfig db.
	 */
	mutex_lock(&nc_mtx);
	ni.ref++;

	if (!nc_file) {
		nc_file = fopen(NETCONFIG, "r");
		if (!nc_file) {
			ni.ref--;
			mutex_unlock(&nc_mtx);
			nc_error = NC_NONETCONFIG;
			mem_free(nc_vars, sizeof(*nc_vars));
			return (NULL);
		}
	}
	nc_vars->valid = NC_VALID;
	nc_vars->flag = 0;
	nc_vars->nc_configs = ni.head;
	mutex_unlock(&nc_mtx);
	return ((void *)nc_vars);
}